

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O1

Expression * __thiscall
wasm::Flatten::getPreludesWithExpression(Flatten *this,Expression *preluder,Expression *after)

{
  ulong uVar1;
  Block *this_00;
  ulong uVar2;
  __node_base_ptr p_Var3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  Builder local_28;
  
  uVar1 = (this->preludes)._M_h._M_bucket_count;
  uVar2 = (ulong)preluder % uVar1;
  p_Var3 = (this->preludes)._M_h._M_buckets[uVar2];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var3->_M_nxt, p_Var4 = p_Var3, (Expression *)p_Var3->_M_nxt[1]._M_nxt != preluder))
  {
    while (p_Var3 = p_Var5, p_Var5 = p_Var3->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)p_Var5[1]._M_nxt % uVar1 != uVar2) ||
         (p_Var4 = p_Var3, (Expression *)p_Var5[1]._M_nxt == preluder)) goto LAB_006f844d;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_006f844d:
  if (p_Var4 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var4->_M_nxt;
  }
  if (p_Var5 != (_Hash_node_base *)0x0) {
    local_28.wasm =
         (this->
         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
         ).
         super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
         .super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
         super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
         currModule;
    this_00 = Builder::
              makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                        (&local_28,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         (p_Var5 + 2));
    if (p_Var5[3]._M_nxt != p_Var5[2]._M_nxt) {
      p_Var5[3]._M_nxt = p_Var5[2]._M_nxt;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,after);
    Block::finalize(this_00);
    after = (Expression *)this_00;
  }
  return (Expression *)(Block *)after;
}

Assistant:

Expression* getPreludesWithExpression(Expression* preluder,
                                        Expression* after) {
    auto iter = preludes.find(preluder);
    if (iter == preludes.end()) {
      return after;
    }
    // we have preludes
    auto& thePreludes = iter->second;
    auto* ret = Builder(*getModule()).makeBlock(thePreludes);
    thePreludes.clear();
    ret->list.push_back(after);
    ret->finalize();
    return ret;
  }